

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpselect.h
# Opt level: O2

int jrtplib::RTPSelect(SocketType *sockets,int8_t *readflags,size_t numsocks,RTPTime timeout)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  size_t i_1;
  double dVar3;
  allocator_type local_49;
  double local_48;
  vector<pollfd,_std::allocator<pollfd>_> fds;
  
  local_48 = timeout.m_t;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&fds,numsocks,&local_49);
  for (sVar2 = 0; numsocks != sVar2; sVar2 = sVar2 + 1) {
    fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data._M_start
    [sVar2].fd = sockets[sVar2];
    fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data._M_start
    [sVar2].events = 1;
    fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data._M_start
    [sVar2].revents = 0;
    readflags[sVar2] = '\0';
  }
  if (0.0 <= local_48) {
    dVar3 = 2147483647.0;
    if (local_48 * 1000.0 <= 2147483647.0) {
      dVar3 = local_48 * 1000.0;
    }
    iVar1 = (int)dVar3;
  }
  else {
    iVar1 = -1;
  }
  iVar1 = poll((pollfd *)
               fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start,numsocks,iVar1);
  if (iVar1 < 0) {
    iVar1 = -0xb4;
  }
  else if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    for (sVar2 = 0; numsocks != sVar2; sVar2 = sVar2 + 1) {
      if (fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar2].revents != 0) {
        readflags[sVar2] = '\x01';
      }
    }
  }
  std::_Vector_base<pollfd,_std::allocator<pollfd>_>::~_Vector_base
            (&fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>);
  return iVar1;
}

Assistant:

inline int RTPSelect(const SocketType *sockets, int8_t *readflags, size_t numsocks, RTPTime timeout)
{
	using namespace std;

	vector<struct pollfd> fds(numsocks);

	for (size_t i = 0 ; i < numsocks ; i++)
	{
		fds[i].fd = sockets[i];
		fds[i].events = POLLIN;
		fds[i].revents = 0;
		readflags[i] = 0;
	}

	int timeoutmsec = -1;
	if (timeout.GetDouble() >= 0)
	{
		double dtimeoutmsec = timeout.GetDouble()*1000.0;
		if (dtimeoutmsec > (numeric_limits<int>::max)()) // parentheses to prevent windows 'max' macro expansion
			dtimeoutmsec = (numeric_limits<int>::max)();
		
		timeoutmsec = (int)dtimeoutmsec;
	}

#ifdef RTP_HAVE_WSAPOLL
	int status = WSAPoll(&(fds[0]), (ULONG)numsocks, timeoutmsec);
#else
	int status = poll(&(fds[0]), numsocks, timeoutmsec);
#endif // RTP_HAVE_WSAPOLL
	if (status < 0)
		return ERR_RTP_SELECT_ERRORINPOLL;

	if (status > 0)
	{
		for (size_t i = 0 ; i < numsocks ; i++)
		{
			if (fds[i].revents)
				readflags[i] = 1;
		}
	}
	return status;
}